

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HAPI.cpp
# Opt level: O2

void solve_fromArrays(int *probStatus,int *basisStatus,int XnumCol,int XnumRow,int XnumNz,
                     int XobjSense,int XobjOffset,double *XcolCost,double *XcolLower,
                     double *XcolUpper,double *XrowLower,double *XrowUpper,int *XAstart,int *XAindex
                     ,double *XAvalue,double *colPrimalValues,double *colDualValues,
                     double *rowPrimalValues,double *rowDualValues,int *basicVariables)

{
  size_t __n;
  vector<double,_std::allocator<double>_> XbasicVariables;
  vector<double,_std::allocator<double>_> XrowDualValues;
  vector<double,_std::allocator<double>_> XrowPrimalValues;
  vector<double,_std::allocator<double>_> XcolDualValues;
  vector<double,_std::allocator<double>_> XcolPrimalValues;
  HModel model;
  HDual solver;
  
  HModel::HModel(&model);
  HModel::load_fromArrays
            (&model,XnumCol,XobjSense,XcolCost,XcolLower,XcolUpper,XnumRow,XrowLower,XrowUpper,
             XnumNz,XAstart,XAindex,XAvalue);
  HModel::scaleModel(&model);
  if (*basisStatus != 0) {
    HModel::replaceWithNewBasis(&model,basicVariables);
  }
  HDual::HDual(&solver);
  HDual::solve(&solver,&model,0,1);
  XcolPrimalValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  XcolDualValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  XcolPrimalValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  XcolPrimalValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  XcolDualValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  XcolDualValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  XrowPrimalValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  XrowPrimalValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  XrowPrimalValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  XrowDualValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  XrowDualValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  XrowDualValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  XbasicVariables.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  XbasicVariables.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  XbasicVariables.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  HModel::util_getPrimalDualValues
            (&model,&XcolPrimalValues,&XcolDualValues,&XrowPrimalValues,&XrowDualValues);
  memcpy(colPrimalValues,
         XcolPrimalValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start,(long)model.numCol << 3);
  __n = (long)model.numRow * 8;
  memcpy(rowPrimalValues,
         XrowPrimalValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start,__n);
  memcpy(colDualValues,
         XcolDualValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start,(long)model.numCol << 3);
  memcpy(rowDualValues,
         XrowDualValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start,__n);
  memcpy(basicVariables,
         model.basicIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start,(long)model.numRow << 2);
  HModel::util_reportSolverOutcome(&model,"Solve plain API");
  HModel::util_reportModelDense(&model);
  *probStatus = model.problemStatus;
  *basisStatus = 1;
  HModel::clearModel(&model);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&XbasicVariables.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&XrowDualValues.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&XrowPrimalValues.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&XcolDualValues.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&XcolPrimalValues.super__Vector_base<double,_std::allocator<double>_>);
  HDual::~HDual(&solver);
  HModel::~HModel(&model);
  return;
}

Assistant:

void solve_fromArrays(int* probStatus, int* basisStatus,
		      const int XnumCol, const int XnumRow, const int XnumNz, 
		      const int XobjSense, const int XobjOffset,
		      const double* XcolCost, const double* XcolLower, const double* XcolUpper,
		      const double* XrowLower, const double* XrowUpper,
		      const int* XAstart, const int* XAindex, const double* XAvalue,
		      double* colPrimalValues, double* colDualValues,
		      double* rowPrimalValues, double* rowDualValues,
		      int* basicVariables) {
  HModel model;
  model.load_fromArrays(XnumCol, XobjSense, XcolCost, XcolLower, XcolUpper,
			XnumRow, XrowLower, XrowUpper,
			XnumNz, XAstart, XAindex, XAvalue);
  model.scaleModel();

  int LcBasisStatus = (*basisStatus);
  //printf("solve_fromArrays: LcBasisStatus = %d\n", LcBasisStatus);fflush(stdout);
  if (LcBasisStatus) {
    //    printf("Basis status is %d\n", LcBasisStatus);
    model.replaceWithNewBasis(basicVariables);
    //    printf("Number of basic logicals is %d\n", model.numBasicLogicals);
  }

  HDual solver;
  solver.solve(&model);
  
  vector<double> XcolPrimalValues;
  vector<double> XcolDualValues;
  vector<double> XrowPrimalValues;
  vector<double> XrowDualValues;
  vector<double> XbasicVariables;
  
  model.util_getPrimalDualValues(XcolPrimalValues, XcolDualValues, XrowPrimalValues, XrowDualValues);

  memcpy(colPrimalValues, &(XcolPrimalValues[0]), sizeof(double)*model.numCol);
  memcpy(rowPrimalValues, &(XrowPrimalValues[0]), sizeof(double)*model.numRow);
  memcpy(colDualValues, &(XcolDualValues[0]), sizeof(double)*model.numCol);
  memcpy(rowDualValues, &(XrowDualValues[0]), sizeof(double)*model.numRow);
  memcpy(basicVariables, &(model.basicIndex[0]), sizeof(int)*model.numRow);
  LcBasisStatus = HiGHS_basisStatus_yes;
  model.util_reportSolverOutcome("Solve plain API");
#ifdef JAJH_dev
  model.util_reportModelDense();
#endif
  //  model.util_reportModel();
  //  model.util_reportModelSolution();

  //  printf("model.problemStatus = %d\n", model.problemStatus);
  (*probStatus) = model.problemStatus;
  (*basisStatus) = LcBasisStatus;
// Remove any current model
  model.clearModel();
  //  printf("solve_fromArrays: probStatus = %d\n", (*probStatus));
  return;
}